

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O0

float float32_unpack(uint32 x)

{
  float fVar1;
  uint in_EDI;
  double dVar2;
  double res;
  uint32 exp;
  uint32 sign;
  uint32 mantissa;
  
  if ((in_EDI & 0x80000000) == 0) {
    fVar1 = (float)(in_EDI & 0x1fffff);
  }
  else {
    fVar1 = -(float)(in_EDI & 0x1fffff);
  }
  dVar2 = (double)SDL_scalbn((double)fVar1,((in_EDI & 0x7fe00000) >> 0x15) - 0x314);
  return (float)dVar2;
}

Assistant:

static float float32_unpack(uint32 x)
{
   // from the specification
   uint32 mantissa = x & 0x1fffff;
   uint32 sign = x & 0x80000000;
   uint32 exp = (x & 0x7fe00000) >> 21;
   double res = sign ? -(double)mantissa : (double)mantissa;
   return (float) ldexp((float)res, exp-788);
}